

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

void google::protobuf::compiler::cpp::GenerateUtf8CheckCode
               (FieldDescriptor *field,Options *options,bool for_parse,char *parameters,
               char *strict_function,char *verify_function,Formatter *format)

{
  Utf8CheckMode UVar1;
  string *psVar2;
  char *local_38;
  char *verify_function_local;
  char *strict_function_local;
  char *parameters_local;
  Options *pOStack_18;
  bool for_parse_local;
  Options *options_local;
  FieldDescriptor *field_local;
  
  local_38 = verify_function;
  verify_function_local = strict_function;
  strict_function_local = parameters;
  parameters_local._7_1_ = for_parse;
  pOStack_18 = options;
  options_local = (Options *)field;
  UVar1 = GetUtf8CheckMode(field,options);
  if (UVar1 == kStrict) {
    if ((parameters_local._7_1_ & 1) != 0) {
      Formatter::operator()<>(format,"DO_(");
    }
    Formatter::operator()
              (format,"::$proto_ns$::internal::WireFormatLite::$1$(\n",&verify_function_local);
    Formatter::Indent(format);
    Formatter::operator()<>(format,strict_function_local);
    if ((parameters_local._7_1_ & 1) == 0) {
      Formatter::operator()<>(format,"::$proto_ns$::internal::WireFormatLite::SERIALIZE,\n");
    }
    else {
      Formatter::operator()<>(format,"::$proto_ns$::internal::WireFormatLite::PARSE,\n");
    }
    psVar2 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)options_local);
    Formatter::operator()(format,"\"$1$\")",psVar2);
    if ((parameters_local._7_1_ & 1) != 0) {
      Formatter::operator()<>(format,")");
    }
    Formatter::operator()<>(format,";\n");
    Formatter::Outdent(format);
  }
  else if (UVar1 == kVerify) {
    Formatter::operator()(format,"::$proto_ns$::internal::WireFormat::$1$(\n",&local_38);
    Formatter::Indent(format);
    Formatter::operator()<>(format,strict_function_local);
    if ((parameters_local._7_1_ & 1) == 0) {
      Formatter::operator()<>(format,"::$proto_ns$::internal::WireFormat::SERIALIZE,\n");
    }
    else {
      Formatter::operator()<>(format,"::$proto_ns$::internal::WireFormat::PARSE,\n");
    }
    psVar2 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)options_local);
    Formatter::operator()(format,"\"$1$\");\n",psVar2);
    Formatter::Outdent(format);
  }
  return;
}

Assistant:

static void GenerateUtf8CheckCode(const FieldDescriptor* field,
                                  const Options& options, bool for_parse,
                                  const char* parameters,
                                  const char* strict_function,
                                  const char* verify_function,
                                  const Formatter& format) {
  switch (GetUtf8CheckMode(field, options)) {
    case Utf8CheckMode::kStrict: {
      if (for_parse) {
        format("DO_(");
      }
      format("::$proto_ns$::internal::WireFormatLite::$1$(\n", strict_function);
      format.Indent();
      format(parameters);
      if (for_parse) {
        format("::$proto_ns$::internal::WireFormatLite::PARSE,\n");
      } else {
        format("::$proto_ns$::internal::WireFormatLite::SERIALIZE,\n");
      }
      format("\"$1$\")", field->full_name());
      if (for_parse) {
        format(")");
      }
      format(";\n");
      format.Outdent();
      break;
    }
    case Utf8CheckMode::kVerify: {
      format("::$proto_ns$::internal::WireFormat::$1$(\n", verify_function);
      format.Indent();
      format(parameters);
      if (for_parse) {
        format("::$proto_ns$::internal::WireFormat::PARSE,\n");
      } else {
        format("::$proto_ns$::internal::WireFormat::SERIALIZE,\n");
      }
      format("\"$1$\");\n", field->full_name());
      format.Outdent();
      break;
    }
    case Utf8CheckMode::kNone:
      break;
  }
}